

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CPU.cpp
# Opt level: O2

uint8_t __thiscall CPU::GetStackByte(CPU *this)

{
  uint8_t uVar1;
  
  uVar1 = ReadByte(this,this->sp + 0x101);
  this->sp = this->sp + '\x01';
  this->cycles = this->cycles - 1;
  return uVar1;
}

Assistant:

uint8_t CPU::GetStackByte()
{
    uint8_t data = ReadByte((0x100 | sp) + 1);
    sp++;
    cycles--;
    return data;
}